

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_analysis.cpp
# Opt level: O1

loop_terminator * __thiscall
loop_variable_state::insert(loop_variable_state *this,ir_if *if_stmt,bool continue_from_then)

{
  exec_node *peVar1;
  void *mem_ctx;
  loop_terminator *plVar2;
  
  mem_ctx = ralloc_parent(this);
  plVar2 = (loop_terminator *)exec_node::operator_new(0x20,mem_ctx);
  (plVar2->super_exec_node).next = (exec_node *)0x0;
  (plVar2->super_exec_node).prev = (exec_node *)0x0;
  plVar2->iterations = -1;
  plVar2->ir = if_stmt;
  plVar2->continue_from_then = continue_from_then;
  (plVar2->super_exec_node).next = &(this->terminators).tail_sentinel;
  peVar1 = (this->terminators).tail_sentinel.prev;
  (plVar2->super_exec_node).prev = peVar1;
  peVar1->next = (exec_node *)plVar2;
  (this->terminators).tail_sentinel.prev = (exec_node *)plVar2;
  return plVar2;
}

Assistant:

loop_terminator *
loop_variable_state::insert(ir_if *if_stmt, bool continue_from_then)
{
   void *mem_ctx = ralloc_parent(this);
   loop_terminator *t = new(mem_ctx) loop_terminator();

   t->ir = if_stmt;
   t->continue_from_then = continue_from_then;

   this->terminators.push_tail(t);

   return t;
}